

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regex.c
# Opt level: O2

void re_alternate_onto(re_context *ctx,re_machine *dest,re_machine *rhs)

{
  re_state_id rVar1;
  re_machine in_RAX;
  re_machine new_machine;
  
  if (dest->init == -1) {
    new_machine = *rhs;
  }
  else {
    if (rhs->init == -1) {
      return;
    }
    new_machine = in_RAX;
    re_init_machine(ctx,&new_machine);
    rVar1 = new_machine.init;
    re_set_trans(ctx,new_machine.init,dest->init,'\x01');
    re_set_trans(ctx,rVar1,rhs->init,'\x01');
    rVar1 = new_machine.final;
    re_set_trans(ctx,dest->final,new_machine.final,'\x01');
    re_set_trans(ctx,rhs->final,rVar1,'\x01');
  }
  *dest = new_machine;
  return;
}

Assistant:

static void re_alternate_onto(re_context *ctx,
                              re_machine *dest, re_machine *rhs)
{
    /* check to see if the first machine is null */
    if (re_is_machine_null(ctx, dest))
    {
        /* 
         *   the first machine is null - simply copy the second machine
         *   onto the first 
         */
        *dest = *rhs;
    }
    else
    {
        /* 
         *   if the second machine is null, don't do anything; otherwise,
         *   build the alternation 
         */
        if (!re_is_machine_null(ctx, rhs))
        {
            re_machine new_machine;
            
            /* build the alternation */
            re_build_alter(ctx, &new_machine, dest, rhs);

            /* replace the first machine with the alternation */
            *dest = new_machine;
        }
    }
}